

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

void BrotliCreateHqZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,H10 *hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  int *piVar1;
  ulong max_backward_limit;
  ushort uVar2;
  ushort uVar3;
  float fVar4;
  uint32_t *puVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  anon_union_4_3_cc401a1e_for_u *paVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  void *__dest;
  ulong uVar15;
  uint8_t *puVar16;
  ulong uVar17;
  ZopfliNode *nodes;
  ulong uVar18;
  size_t sVar19;
  void *pvVar20;
  uint *puVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  int *piVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint8_t *puVar40;
  long lVar41;
  uint8_t *puVar42;
  bool bVar43;
  ulong local_2f70;
  ulong local_2f68;
  ulong local_2f60;
  void *local_2f30;
  void *local_2f20;
  ulong local_2f00;
  ulong local_2ef8;
  ulong local_2ec8;
  int orig_dist_cache [4];
  ZopfliCostModel model;
  uint32_t histogram_literal [256];
  uint32_t histogram_cmd [704];
  float cost_literal [256];
  uint32_t histogram_dist [520];
  
  iVar13 = params->lgwin;
  if (num_bytes == 0) {
    local_2f20 = (void *)0x0;
  }
  else {
    local_2f20 = BrotliAllocate(m,num_bytes * 4);
  }
  local_2ec8 = num_bytes * 4;
  local_2f30 = (void *)0x0;
  pvVar20 = (void *)(num_bytes - 0x7f);
  if (num_bytes < 0x7f) {
    pvVar20 = local_2f30;
  }
  if (local_2ec8 != 0) {
    local_2f30 = BrotliAllocate(m,num_bytes << 5);
  }
  max_backward_limit = (1L << ((byte)iVar13 & 0x3f)) - 0x10;
  if (3 < num_bytes) {
    lVar22 = 0;
    uVar18 = 0;
    do {
      uVar23 = lVar22 + position;
      uVar36 = max_backward_limit;
      if (uVar23 < max_backward_limit) {
        uVar36 = uVar23;
      }
      uVar15 = uVar18 + 0x80;
      if (local_2ec8 < uVar15) {
        uVar24 = local_2ec8;
        if (local_2ec8 == 0) {
          uVar24 = uVar15;
        }
        do {
          uVar30 = uVar24;
          uVar24 = uVar30 * 2;
        } while (uVar30 < uVar15);
        if (uVar30 == 0) {
          __dest = (void *)0x0;
        }
        else {
          __dest = BrotliAllocate(m,uVar30 * 8);
        }
        if (local_2ec8 != 0) {
          memcpy(__dest,local_2f30,local_2ec8 << 3);
        }
        BrotliFree(m,local_2f30);
        local_2f30 = __dest;
        local_2ec8 = uVar30;
      }
      uVar30 = num_bytes - lVar22;
      uVar24 = uVar23 & ringbuffer_mask;
      uVar15 = 0x10;
      if (params->quality == 0xb) {
        uVar15 = 0x40;
      }
      uVar33 = 0;
      if (uVar15 <= uVar23) {
        uVar33 = uVar23 - uVar15;
      }
      piVar1 = (int *)((long)local_2f30 + uVar18 * 8);
      puVar16 = ringbuffer + uVar24;
      uVar17 = (ulong)((uint)uVar30 & 7);
      uVar34 = 1;
      piVar31 = piVar1;
      uVar15 = uVar23;
      do {
        uVar15 = uVar15 - 1;
        if ((uVar15 <= uVar33) || (2 < uVar34)) break;
        uVar32 = uVar23 - uVar15;
        if ((uVar32 <= uVar36) &&
           ((uVar27 = uVar15 & ringbuffer_mask, *puVar16 == ringbuffer[uVar27] &&
            (puVar16[1] == ringbuffer[uVar27 + 1])))) {
          if (7 < uVar30) {
            lVar41 = 0;
            uVar38 = 0;
LAB_0010f4d9:
            if (*(ulong *)(puVar16 + uVar38 * 8) == *(ulong *)(ringbuffer + uVar38 * 8 + uVar27))
            goto code_r0x0010f4e6;
            uVar38 = *(ulong *)(ringbuffer + uVar38 * 8 + uVar27) ^ *(ulong *)(puVar16 + uVar38 * 8)
            ;
            uVar27 = 0;
            if (uVar38 != 0) {
              for (; (uVar38 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
            uVar38 = (uVar27 >> 3 & 0x1fffffff) - lVar41;
            goto LAB_0010f534;
          }
          uVar39 = 0;
          puVar42 = puVar16;
LAB_0010f55d:
          uVar38 = uVar39;
          if (uVar17 != 0) {
            uVar35 = uVar17 | uVar39;
            uVar37 = uVar17;
            do {
              uVar38 = uVar39;
              if (ringbuffer[uVar39 + uVar27] != *puVar42) break;
              puVar42 = puVar42 + 1;
              uVar39 = uVar39 + 1;
              uVar37 = uVar37 - 1;
              uVar38 = uVar35;
            } while (uVar37 != 0);
          }
LAB_0010f534:
          if (uVar34 < uVar38) {
            *piVar31 = (int)uVar32;
            piVar31[1] = (int)uVar38 << 5;
            piVar31 = piVar31 + 2;
            uVar34 = uVar38;
          }
        }
      } while (uVar32 <= uVar36);
      if (uVar34 < uVar30) {
        uVar12 = (uint)(*(int *)(ringbuffer + uVar24) * 0x1e35a7bd) >> 0xf;
        uVar33 = (ulong)hasher->buckets_[uVar12];
        uVar15 = uVar30;
        if (0x7f < uVar30) {
          hasher->buckets_[uVar12] = (uint32_t)uVar23;
          uVar15 = 0x80;
        }
        puVar16 = ringbuffer + uVar24;
        uVar17 = hasher->window_mask_;
        lVar41 = (uVar17 & uVar23) * 2 + 1;
        lVar25 = (uVar17 & uVar23) * 2;
        lVar28 = 0x40;
        local_2ef8 = 0;
        local_2f00 = 0;
LAB_0010f637:
        uVar32 = uVar23 - uVar33;
        if ((uVar32 != 0) && (lVar28 != 0 && uVar32 <= uVar36)) {
          uVar27 = local_2f00;
          if (local_2ef8 < local_2f00) {
            uVar27 = local_2ef8;
          }
          if (0x80 < uVar27) {
LAB_00110489:
            __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                          ,0x9d,
                          "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                         );
          }
          puVar40 = ringbuffer + (uVar33 & ringbuffer_mask);
          puVar42 = puVar40 + uVar27;
          uVar38 = uVar30 - uVar27;
          if (7 < uVar38) {
            uVar37 = uVar38 & 0xfffffffffffffff8;
            lVar29 = 0;
            uVar39 = 0;
LAB_0010f6fa:
            if (*(ulong *)(puVar42 + uVar39 * 8) == *(ulong *)(puVar16 + uVar39 * 8 + uVar27))
            goto code_r0x0010f707;
            uVar39 = *(ulong *)(puVar16 + uVar39 * 8 + uVar27) ^ *(ulong *)(puVar42 + uVar39 * 8);
            uVar38 = 0;
            if (uVar39 != 0) {
              for (; (uVar39 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
              }
            }
            uVar39 = (uVar38 >> 3 & 0x1fffffff) - lVar29;
            goto LAB_0010f729;
          }
          uVar37 = 0;
          goto LAB_0010f861;
        }
        if (0x7f < uVar30) {
          puVar5 = hasher->forest_;
          puVar5[lVar25] = hasher->invalid_pos_;
          puVar5[lVar41] = hasher->invalid_pos_;
        }
        bVar43 = false;
        goto LAB_0010f67f;
      }
LAB_0010f894:
      lVar41 = 0;
      do {
        model.cost_cmd_[lVar41] = 2.5243547e-29;
        lVar41 = lVar41 + 1;
      } while (lVar41 != 0x26);
      uVar34 = uVar34 + 1;
      if (uVar34 < 5) {
        uVar34 = 4;
      }
      iVar13 = BrotliFindAllStaticDictionaryMatches
                         (ringbuffer + uVar24,uVar34,uVar30,(uint32_t *)&model);
      if (iVar13 != 0) {
        if (0x24 < uVar30) {
          uVar30 = 0x25;
        }
        if (uVar34 <= uVar30) {
          iVar13 = (int)uVar34 << 5;
          do {
            fVar4 = model.cost_cmd_[uVar34];
            if ((uint)fVar4 < 0xfffffff) {
              uVar12 = (uint)fVar4 & 0x1f;
              *piVar31 = ((uint)fVar4 >> 5) + (int)uVar36 + 1;
              if (uVar34 == uVar12) {
                uVar12 = 0;
              }
              piVar31[1] = uVar12 + iVar13;
              piVar31 = piVar31 + 2;
            }
            uVar34 = uVar34 + 1;
            iVar13 = iVar13 + 0x20;
          } while (uVar30 + 1 != uVar34);
        }
      }
      lVar41 = (long)piVar31 - (long)piVar1 >> 3;
      uVar15 = lVar41 + uVar18;
      if (uVar18 + 1 < uVar15) {
        lVar25 = 1;
        do {
          if ((uint)piVar1[lVar25 * 2 + 1] >> 5 <= (uint)piVar1[lVar25 * 2 + -1] >> 5) {
            __assert_fail("BackwardMatchLength(&matches[j]) < BackwardMatchLength(&matches[j + 1])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/backward_references_hq.c"
                          ,0x2d3,
                          "void BrotliCreateHqZopfliBackwardReferences(MemoryManager *, size_t, size_t, const uint8_t *, size_t, const BrotliEncoderParams *, H10 *, int *, size_t *, Command *, size_t *, size_t *)"
                         );
          }
          if (((uint)piVar1[lVar25 * 2 + -2] <= uVar36) &&
             ((uint)piVar1[lVar25 * 2] < (uint)piVar1[lVar25 * 2 + -2])) {
            __assert_fail("matches[j].distance > max_distance || matches[j].distance <= matches[j + 1].distance"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/backward_references_hq.c"
                          ,0x2d5,
                          "void BrotliCreateHqZopfliBackwardReferences(MemoryManager *, size_t, size_t, const uint8_t *, size_t, const BrotliEncoderParams *, H10 *, int *, size_t *, Command *, size_t *, size_t *)"
                         );
          }
          lVar25 = lVar25 + 1;
        } while (lVar41 != lVar25);
      }
      *(int *)((long)local_2f20 + lVar22 * 4) = (int)lVar41;
      uVar36 = uVar18;
      if ((piVar31 != piVar1) &&
         (uVar12 = *(uint *)((long)local_2f30 + uVar15 * 8 + -4), uVar36 = uVar15, 0x28bf < uVar12))
      {
        uVar30 = (ulong)(uVar12 >> 5);
        uVar36 = uVar23 + 1;
        uVar24 = uVar30 + uVar23;
        if ((long)pvVar20 + position <= uVar24) {
          uVar24 = (long)pvVar20 + position;
        }
        uVar33 = uVar24 - 0x3f;
        if (uVar24 < uVar23 + 0x40) {
          uVar33 = uVar36;
        }
        *(undefined8 *)((long)local_2f30 + uVar18 * 8) =
             *(undefined8 *)((long)local_2f30 + uVar15 * 8 + -8);
        *(undefined4 *)((long)local_2f20 + lVar22 * 4) = 1;
        if ((uVar23 + 0x201 <= uVar33) && (uVar36 < uVar33)) {
          uVar23 = hasher->window_mask_;
LAB_0010fa95:
          puVar16 = ringbuffer + (uVar36 & ringbuffer_mask);
          uVar12 = (uint)(*(int *)(ringbuffer + (uVar36 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
          uVar17 = (ulong)hasher->buckets_[uVar12];
          uVar15 = (uVar23 & uVar36) * 2 + 1;
          uVar34 = (uVar23 & uVar36) * 2;
          hasher->buckets_[uVar12] = (uint32_t)uVar36;
          lVar41 = 0x40;
          local_2f68 = 0;
          local_2f70 = 0;
LAB_0010fae4:
          if ((uVar36 == uVar17) || (lVar41 == 0 || uVar23 - 0xf < uVar36 - uVar17)) {
            puVar5 = hasher->forest_;
            puVar5[uVar34] = hasher->invalid_pos_;
            puVar5[uVar15] = hasher->invalid_pos_;
            bVar43 = false;
            goto LAB_0010fb1c;
          }
          uVar32 = local_2f70;
          if (local_2f68 < local_2f70) {
            uVar32 = local_2f68;
          }
          if (uVar32 < 0x81) {
            puVar40 = ringbuffer + (uVar17 & ringbuffer_mask);
            puVar42 = puVar40 + uVar32;
            uVar27 = 0x80 - uVar32;
            if (7 < uVar27) {
              uVar39 = uVar27 & 0xfffffffffffffff8;
              lVar25 = 0;
              uVar38 = 0;
LAB_0010fb86:
              if (*(ulong *)(puVar42 + uVar38 * 8) == *(ulong *)(puVar16 + uVar38 * 8 + uVar32))
              goto code_r0x0010fb93;
              uVar38 = *(ulong *)(puVar16 + uVar38 * 8 + uVar32) ^ *(ulong *)(puVar42 + uVar38 * 8);
              uVar27 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar38 = (uVar27 >> 3 & 0x1fffffff) - lVar25;
              goto LAB_0010fbb5;
            }
            uVar39 = 0;
            goto LAB_0010fc93;
          }
          goto LAB_00110489;
        }
LAB_0010fcd5:
        if (uVar33 < uVar24) {
          uVar23 = hasher->window_mask_;
LAB_0010fcf1:
          puVar16 = ringbuffer + (uVar33 & ringbuffer_mask);
          uVar12 = (uint)(*(int *)(ringbuffer + (uVar33 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
          uVar34 = (ulong)hasher->buckets_[uVar12];
          uVar36 = (uVar23 & uVar33) * 2 + 1;
          uVar15 = (uVar23 & uVar33) * 2;
          hasher->buckets_[uVar12] = (uint32_t)uVar33;
          lVar41 = 0x40;
          local_2f60 = 0;
          local_2f68 = 0;
LAB_0010fd45:
          if ((uVar33 == uVar34) || (lVar41 == 0 || uVar23 - 0xf < uVar33 - uVar34)) {
            puVar5 = hasher->forest_;
            puVar5[uVar15] = hasher->invalid_pos_;
            puVar5[uVar36] = hasher->invalid_pos_;
            bVar43 = false;
            goto LAB_0010fd7f;
          }
          uVar17 = local_2f68;
          if (local_2f60 < local_2f68) {
            uVar17 = local_2f60;
          }
          if (uVar17 < 0x81) {
            puVar40 = ringbuffer + (uVar34 & ringbuffer_mask);
            puVar42 = puVar40 + uVar17;
            uVar32 = 0x80 - uVar17;
            if (7 < uVar32) {
              uVar38 = uVar32 & 0xfffffffffffffff8;
              lVar25 = 0;
              uVar27 = 0;
LAB_0010fde4:
              if (*(ulong *)(puVar42 + uVar27 * 8) == *(ulong *)(puVar16 + uVar27 * 8 + uVar17))
              goto code_r0x0010fdf1;
              uVar27 = *(ulong *)(puVar16 + uVar27 * 8 + uVar17) ^ *(ulong *)(puVar42 + uVar27 * 8);
              uVar32 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
                }
              }
              uVar27 = (uVar32 >> 3 & 0x1fffffff) - lVar25;
              goto LAB_0010fe13;
            }
            uVar38 = 0;
            goto LAB_0010fee8;
          }
          goto LAB_00110489;
        }
LAB_0010ff2b:
        lVar41 = uVar30 - 1;
        memset((void *)((long)local_2f20 + lVar22 * 4 + 4),0,lVar41 * 4);
        lVar22 = lVar22 + lVar41;
        uVar36 = uVar18 + 1;
      }
      uVar23 = lVar22 + 4;
      lVar22 = lVar22 + 1;
      uVar18 = uVar36;
    } while (uVar23 < num_bytes);
  }
  sVar6 = *num_literals;
  sVar7 = *last_insert_len;
  uVar9 = *(undefined8 *)dist_cache;
  uVar10 = *(undefined8 *)(dist_cache + 2);
  sVar8 = *num_commands;
  lVar22 = num_bytes + 1;
  if (lVar22 == 0) {
    nodes = (ZopfliNode *)0x0;
  }
  else {
    nodes = (ZopfliNode *)BrotliAllocate(m,lVar22 * 0x10);
  }
  model.num_bytes_ = num_bytes;
  if (num_bytes + 2 == 0) {
    model.literal_costs_ = (float *)0x0;
  }
  else {
    model.literal_costs_ = (float *)BrotliAllocate(m,(num_bytes + 2) * 4);
  }
  lVar41 = lVar22;
  paVar11 = &nodes->u;
  lVar25 = 0;
  do {
    for (; lVar41 != 0; lVar41 = lVar41 + -1) {
      ((ZopfliNode *)(paVar11 + -3))->length = 1;
      paVar11[-2].cost = 0.0;
      paVar11[-1].cost = 0.0;
      paVar11->next = 0x7effc99e;
      paVar11 = paVar11 + 4;
    }
    if (lVar25 == 0) {
      ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
    }
    else {
      sVar26 = *num_commands;
      memset(histogram_literal,0,0x400);
      memset(histogram_cmd,0,0xb00);
      memset(histogram_dist,0,0x820);
      if (sVar26 != sVar8) {
        lVar41 = 0;
        uVar18 = position - sVar7;
        do {
          uVar15 = (ulong)commands[lVar41].insert_len_;
          uVar12 = commands[lVar41].copy_len_;
          uVar2 = commands[lVar41].dist_prefix_;
          uVar3 = commands[lVar41].cmd_prefix_;
          histogram_cmd[uVar3] = histogram_cmd[uVar3] + 1;
          uVar23 = uVar18;
          uVar36 = uVar15;
          if (0x7f < uVar3) {
            histogram_dist[uVar2] = histogram_dist[uVar2] + 1;
          }
          for (; uVar36 != 0; uVar36 = uVar36 - 1) {
            histogram_literal[ringbuffer[uVar23 & ringbuffer_mask]] =
                 histogram_literal[ringbuffer[uVar23 & ringbuffer_mask]] + 1;
            uVar23 = uVar23 + 1;
          }
          uVar18 = uVar18 + uVar15 + (ulong)(uVar12 & 0xffffff);
          lVar41 = lVar41 + 1;
        } while (lVar41 != sVar26 - sVar8);
      }
      SetCost(histogram_literal,0x100,cost_literal);
      SetCost(histogram_cmd,0x2c0,model.cost_cmd_);
      SetCost(histogram_dist,0x208,model.cost_dist_);
      model.min_cost_cmd_ = 1.7e+38;
      lVar41 = 0;
      do {
        if (model.cost_cmd_[lVar41] <= model.min_cost_cmd_) {
          model.min_cost_cmd_ = model.cost_cmd_[lVar41];
        }
        lVar41 = lVar41 + 1;
      } while (lVar41 != 0x2c0);
      *model.literal_costs_ = 0.0;
      if (model.num_bytes_ != 0) {
        sVar26 = 0;
        do {
          model.literal_costs_[sVar26 + 1] =
               model.literal_costs_[sVar26] +
               cost_literal[ringbuffer[position + sVar26 & ringbuffer_mask]];
          sVar26 = sVar26 + 1;
        } while (model.num_bytes_ != sVar26);
      }
    }
    *num_commands = sVar8;
    *num_literals = sVar6;
    *last_insert_len = sVar7;
    *(undefined8 *)dist_cache = uVar9;
    *(undefined8 *)(dist_cache + 2) = uVar10;
    uVar12 = 0x145;
    if (params->quality < 0xb) {
      uVar12 = 0x96;
    }
    nodes->length = 0;
    (nodes->u).cost = 0.0;
    histogram_cmd[0x40] = 0;
    histogram_cmd[0x41] = 0;
    if (3 < num_bytes) {
      lVar41 = 0;
      sVar26 = 0;
      do {
        sVar19 = UpdateNodes(num_bytes,position,sVar26,ringbuffer,ringbuffer_mask,params,
                             max_backward_limit,dist_cache,
                             (ulong)*(uint *)((long)local_2f20 + sVar26 * 4),
                             (BackwardMatch *)((long)local_2f30 + lVar41 * 8),&model,
                             (StartPosQueue *)histogram_cmd,nodes);
        uVar18 = 0;
        if (0x3fff < sVar19) {
          uVar18 = sVar19;
        }
        uVar23 = (ulong)*(uint *)((long)local_2f20 + sVar26 * 4);
        lVar41 = lVar41 + uVar23;
        if (((uVar23 == 1) &&
            (uVar14 = *(uint *)((long)local_2f30 + lVar41 * 8 + -4) >> 5, uVar12 < uVar14)) &&
           (uVar18 < uVar14)) {
          uVar18 = (ulong)uVar14;
        }
        if (1 < uVar18) {
          lVar28 = uVar18 - 1;
          uVar18 = sVar26 + 4;
          do {
            sVar26 = uVar18 - 3;
            if (num_bytes <= uVar18) break;
            EvaluateNode(position,sVar26,max_backward_limit,dist_cache,&model,
                         (StartPosQueue *)histogram_cmd,nodes);
            lVar41 = lVar41 + (ulong)*(uint *)((long)local_2f20 + uVar18 * 4 + -0xc);
            uVar18 = uVar18 + 1;
            lVar28 = lVar28 + -1;
          } while (lVar28 != 0);
        }
        uVar18 = sVar26 + 4;
        sVar26 = sVar26 + 1;
      } while (uVar18 < num_bytes);
    }
    sVar26 = ComputeShortestPathFromNodes(num_bytes,nodes);
    *num_commands = *num_commands + sVar26;
    BrotliZopfliCreateCommands
              (num_bytes,position,max_backward_limit,nodes,dist_cache,last_insert_len,commands,
               num_literals);
    bVar43 = lVar25 != 0;
    lVar41 = lVar22;
    paVar11 = &nodes->u;
    lVar25 = lVar25 + 1;
    if (bVar43) {
      BrotliFree(m,model.literal_costs_);
      model.literal_costs_ = (float *)0x0;
      BrotliFree(m,nodes);
      BrotliFree(m,local_2f30);
      BrotliFree(m,local_2f20);
      return;
    }
  } while( true );
code_r0x0010f4e6:
  uVar38 = uVar38 + 1;
  lVar41 = lVar41 + -8;
  uVar39 = uVar30 & 0xfffffffffffffff8;
  puVar42 = puVar16 + (uVar30 & 0xfffffffffffffff8);
  if (uVar30 >> 3 == uVar38) goto LAB_0010f55d;
  goto LAB_0010f4d9;
code_r0x0010f707:
  uVar39 = uVar39 + 1;
  lVar29 = lVar29 + -8;
  if (uVar38 >> 3 == uVar39) goto code_r0x0010f713;
  goto LAB_0010f6fa;
code_r0x0010f713:
  puVar42 = puVar42 + -lVar29;
LAB_0010f861:
  uVar38 = uVar38 & 7;
  uVar39 = uVar37;
  if (uVar38 != 0) {
    uVar35 = uVar37 | uVar38;
    do {
      uVar39 = uVar37;
      if (puVar16[uVar37 + uVar27] != *puVar42) break;
      puVar42 = puVar42 + 1;
      uVar37 = uVar37 + 1;
      uVar38 = uVar38 - 1;
      uVar39 = uVar35;
    } while (uVar38 != 0);
  }
LAB_0010f729:
  uVar39 = uVar39 + uVar27;
  iVar13 = bcmp(puVar16,puVar40,uVar39);
  if (iVar13 != 0) {
LAB_001104a8:
    __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                  ,0xa2,
                  "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                 );
  }
  if (piVar31 == (int *)0x0) {
    piVar31 = (int *)0x0;
  }
  else if (uVar34 < uVar39) {
    *piVar31 = (int)uVar32;
    piVar31[1] = (int)uVar39 << 5;
    piVar31 = piVar31 + 2;
    uVar34 = uVar39;
  }
  if (uVar39 < uVar15) {
    if (puVar40[uVar39] < puVar16[uVar39]) {
      if (0x7f < uVar30) {
        hasher->forest_[lVar25] = (uint32_t)uVar33;
      }
      lVar25 = (uVar33 & uVar17) * 2 + 1;
      lVar29 = lVar25;
      local_2ef8 = uVar39;
    }
    else {
      if (0x7f < uVar30) {
        hasher->forest_[lVar41] = (uint32_t)uVar33;
      }
      lVar29 = (uVar33 & uVar17) * 2;
      lVar41 = lVar29;
      local_2f00 = uVar39;
    }
    uVar33 = (ulong)hasher->forest_[lVar29];
    bVar43 = true;
  }
  else {
    if (0x7f < uVar30) {
      puVar5 = hasher->forest_;
      puVar5[lVar25] = puVar5[(uVar33 & uVar17) * 2];
      puVar5[lVar41] = puVar5[(uVar33 & uVar17) * 2 + 1];
    }
    bVar43 = false;
  }
LAB_0010f67f:
  lVar28 = lVar28 + -1;
  if (!bVar43) goto LAB_0010f894;
  goto LAB_0010f637;
code_r0x0010fb93:
  uVar38 = uVar38 + 1;
  lVar25 = lVar25 + -8;
  if (uVar27 >> 3 == uVar38) goto code_r0x0010fb9f;
  goto LAB_0010fb86;
code_r0x0010fb9f:
  puVar42 = puVar42 + -lVar25;
LAB_0010fc93:
  uVar27 = uVar27 & 7;
  uVar38 = uVar39;
  if (uVar27 != 0) {
    uVar37 = uVar39 | uVar27;
    do {
      uVar38 = uVar39;
      if (puVar16[uVar39 + uVar32] != *puVar42) break;
      puVar42 = puVar42 + 1;
      uVar39 = uVar39 + 1;
      uVar27 = uVar27 - 1;
      uVar38 = uVar37;
    } while (uVar27 != 0);
  }
LAB_0010fbb5:
  uVar38 = uVar38 + uVar32;
  iVar13 = bcmp(puVar16,puVar40,uVar38);
  if (iVar13 != 0) goto LAB_001104a8;
  if (uVar38 < 0x80) {
    uVar27 = uVar17 & uVar23;
    uVar32 = uVar27 * 2;
    if (puVar40[uVar38] < puVar16[uVar38]) {
      puVar5 = hasher->forest_;
      puVar5[uVar34] = (uint32_t)uVar17;
      puVar21 = puVar5 + uVar27 * 2 + 1;
      uVar34 = uVar32 | 1;
      uVar32 = uVar15;
      local_2f68 = uVar38;
    }
    else {
      puVar5 = hasher->forest_;
      puVar5[uVar15] = (uint32_t)uVar17;
      puVar21 = puVar5 + uVar27 * 2;
      local_2f70 = uVar38;
    }
    uVar17 = (ulong)*puVar21;
    bVar43 = true;
    uVar15 = uVar32;
  }
  else {
    puVar5 = hasher->forest_;
    puVar5[uVar34] = puVar5[(uVar17 & uVar23) * 2];
    puVar5[uVar15] = puVar5[(uVar17 & uVar23) * 2 + 1];
    bVar43 = false;
  }
LAB_0010fb1c:
  lVar41 = lVar41 + -1;
  if (!bVar43) goto LAB_0010fcc3;
  goto LAB_0010fae4;
LAB_0010fcc3:
  uVar36 = uVar36 + 8;
  if (uVar33 <= uVar36) goto LAB_0010fcd5;
  goto LAB_0010fa95;
code_r0x0010fdf1:
  uVar27 = uVar27 + 1;
  lVar25 = lVar25 + -8;
  if (uVar32 >> 3 == uVar27) goto code_r0x0010fdfd;
  goto LAB_0010fde4;
code_r0x0010fdfd:
  puVar42 = puVar42 + -lVar25;
LAB_0010fee8:
  uVar32 = uVar32 & 7;
  uVar27 = uVar38;
  if (uVar32 != 0) {
    uVar39 = uVar38 | uVar32;
    do {
      uVar27 = uVar38;
      if (puVar16[uVar38 + uVar17] != *puVar42) break;
      puVar42 = puVar42 + 1;
      uVar38 = uVar38 + 1;
      uVar32 = uVar32 - 1;
      uVar27 = uVar39;
    } while (uVar32 != 0);
  }
LAB_0010fe13:
  uVar27 = uVar27 + uVar17;
  iVar13 = bcmp(puVar16,puVar40,uVar27);
  if (iVar13 != 0) goto LAB_001104a8;
  if (uVar27 < 0x80) {
    uVar32 = uVar34 & uVar23;
    uVar17 = uVar32 * 2;
    if (puVar40[uVar27] < puVar16[uVar27]) {
      puVar5 = hasher->forest_;
      puVar5[uVar15] = (uint32_t)uVar34;
      puVar21 = puVar5 + uVar32 * 2 + 1;
      uVar15 = uVar17 | 1;
      uVar17 = uVar36;
      local_2f60 = uVar27;
    }
    else {
      puVar5 = hasher->forest_;
      puVar5[uVar36] = (uint32_t)uVar34;
      puVar21 = puVar5 + uVar32 * 2;
      local_2f68 = uVar27;
    }
    uVar34 = (ulong)*puVar21;
    bVar43 = true;
    uVar36 = uVar17;
  }
  else {
    puVar5 = hasher->forest_;
    puVar5[uVar15] = puVar5[(uVar34 & uVar23) * 2];
    puVar5[uVar36] = puVar5[(uVar34 & uVar23) * 2 + 1];
    bVar43 = false;
  }
LAB_0010fd7f:
  lVar41 = lVar41 + -1;
  if (!bVar43) goto LAB_0010ff18;
  goto LAB_0010fd45;
LAB_0010ff18:
  uVar33 = uVar33 + 1;
  if (uVar24 <= uVar33) goto LAB_0010ff2b;
  goto LAB_0010fcf1;
}

Assistant:

void BrotliCreateHqZopfliBackwardReferences(
    MemoryManager* m, size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, H10* hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  uint32_t* num_matches = BROTLI_ALLOC(m, uint32_t, num_bytes);
  size_t matches_size = 4 * num_bytes;
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t cur_match_pos = 0;
  size_t i;
  size_t orig_num_literals;
  size_t orig_last_insert_len;
  int orig_dist_cache[4];
  size_t orig_num_commands;
  ZopfliCostModel model;
  ZopfliNode* nodes;
  BackwardMatch* matches = BROTLI_ALLOC(m, BackwardMatch, matches_size);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; ++i) {
    const size_t pos = position + i;
    size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t max_length = num_bytes - i;
    size_t num_found_matches;
    size_t cur_match_end;
    size_t j;
    /* Ensure that we have enough free slots. */
    BROTLI_ENSURE_CAPACITY(m, BackwardMatch, matches, matches_size,
        cur_match_pos + MAX_NUM_MATCHES_H10);
    if (BROTLI_IS_OOM(m)) return;
    num_found_matches = FindAllMatchesH10(hasher, ringbuffer, ringbuffer_mask,
        pos, max_length, max_distance, params, &matches[cur_match_pos]);
    cur_match_end = cur_match_pos + num_found_matches;
    for (j = cur_match_pos; j + 1 < cur_match_end; ++j) {
      assert(BackwardMatchLength(&matches[j]) <
          BackwardMatchLength(&matches[j + 1]));
      assert(matches[j].distance > max_distance ||
             matches[j].distance <= matches[j + 1].distance);
    }
    num_matches[i] = (uint32_t)num_found_matches;
    if (num_found_matches > 0) {
      const size_t match_len = BackwardMatchLength(&matches[cur_match_end - 1]);
      if (match_len > MAX_ZOPFLI_LEN_QUALITY_11) {
        const size_t skip = match_len - 1;
        matches[cur_match_pos++] = matches[cur_match_end - 1];
        num_matches[i] = 1;
        /* Add the tail of the copy to the hasher. */
        StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1,
                      BROTLI_MIN(size_t, pos + match_len, store_end));
        memset(&num_matches[i + 1], 0, skip * sizeof(num_matches[0]));
        i += skip;
      } else {
        cur_match_pos = cur_match_end;
      }
    }
  }
  orig_num_literals = *num_literals;
  orig_last_insert_len = *last_insert_len;
  memcpy(orig_dist_cache, dist_cache, 4 * sizeof(dist_cache[0]));
  orig_num_commands = *num_commands;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  InitZopfliCostModel(m, &model, num_bytes);
  if (BROTLI_IS_OOM(m)) return;
  for (i = 0; i < 2; i++) {
    BrotliInitZopfliNodes(nodes, num_bytes + 1);
    if (i == 0) {
      ZopfliCostModelSetFromLiteralCosts(
          &model, position, ringbuffer, ringbuffer_mask);
    } else {
      ZopfliCostModelSetFromCommands(&model, position, ringbuffer,
          ringbuffer_mask, commands, *num_commands - orig_num_commands,
          orig_last_insert_len);
    }
    *num_commands = orig_num_commands;
    *num_literals = orig_num_literals;
    *last_insert_len = orig_last_insert_len;
    memcpy(dist_cache, orig_dist_cache, 4 * sizeof(dist_cache[0]));
    *num_commands += ZopfliIterate(num_bytes, position, ringbuffer,
        ringbuffer_mask, params, max_backward_limit, dist_cache,
        &model, num_matches, matches, nodes);
    BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit,
        nodes, dist_cache, last_insert_len, commands, num_literals);
  }
  CleanupZopfliCostModel(m, &model);
  BROTLI_FREE(m, nodes);
  BROTLI_FREE(m, matches);
  BROTLI_FREE(m, num_matches);
}